

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

bool computeDualObjectiveValue(HighsLp *lp,HighsSolution *solution,double *dual_objective_value)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  *dual_objective_value = 0.0;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    *dual_objective_value = lp->offset_;
    iVar4 = lp->num_col_;
    lVar6 = (long)iVar4;
    uVar8 = lp->num_row_ + iVar4;
    if (uVar8 != 0 && SCARRY4(lp->num_row_,iVar4) == (int)uVar8 < 0) {
      dVar14 = *dual_objective_value;
      lVar9 = lVar6 * -8;
      lVar10 = 0;
      uVar11 = 0;
      do {
        pdVar7 = (double *)
                 ((long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar9);
        pdVar5 = (double *)
                 ((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar9);
        pdVar12 = (double *)
                  ((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar9);
        if ((long)uVar11 < lVar6) {
          pdVar7 = (double *)
                   ((long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar10);
          pdVar5 = (double *)
                   ((long)(solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar10);
          pdVar12 = (double *)
                    ((long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar10);
        }
        dVar1 = *pdVar12;
        dVar2 = *pdVar7;
        if ((-INFINITY < dVar1) || (dVar15 = 1.0, dVar2 < INFINITY)) {
          pdVar12 = (double *)
                    ((long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar9);
          if ((long)uVar11 < lVar6) {
            pdVar12 = (double *)
                      ((long)(solution->col_value).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10);
          }
          uVar13 = -(ulong)(*pdVar12 < (dVar1 + dVar2) * 0.5);
          dVar15 = (double)(~uVar13 & (ulong)dVar2 | (ulong)dVar1 & uVar13);
        }
        dVar14 = dVar14 + dVar15 * *pdVar5;
        *dual_objective_value = dVar14;
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 8;
        lVar10 = lVar10 + 8;
      } while (uVar8 != uVar11);
    }
  }
  return bVar3;
}

Assistant:

bool computeDualObjectiveValue(const HighsLp& lp, const HighsSolution& solution,
                               double& dual_objective_value) {
  dual_objective_value = 0;
  if (!solution.dual_valid) return false;
  // #2184 Make sure that the solution corresponds to this LP
  assert(solution.col_value.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.col_dual.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.row_value.size() == static_cast<size_t>(lp.num_row_));
  assert(solution.row_dual.size() == static_cast<size_t>(lp.num_row_));

  dual_objective_value = lp.offset_;
  double bound = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      bound = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      bound = primal < mid ? lower : upper;
    }
    dual_objective_value += bound * dual;
  }
  return true;
}